

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O2

socket_t net_accept(socket_t listenfd,sockaddr_in *addr)

{
  int fd;
  uint len;
  
  len = 0x10;
  fd = accept(listenfd,(sockaddr *)addr,&len);
  if (fd < 0) {
    fd = -1;
  }
  else {
    set_no_block(fd);
    set_no_delay(fd);
  }
  return fd;
}

Assistant:

socket_t net_accept(socket_t listenfd, sockaddr_in& addr)
{
#if defined(__linux__) || defined(__APPLE__)
    unsigned int len = sizeof (struct sockaddr_in);
#else
    int len = sizeof (struct sockaddr_in);
#endif

    socket_t fd = ::accept(listenfd, (struct sockaddr*)&addr, &len);
    if (fd < 0)
    {
        return -1;
    }

    set_no_block(fd);
    set_no_delay(fd);
    return fd;
}